

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O3

TimestampCastResult
duckdb::Timestamp::TryConvertTimestamp
          (char *str,idx_t len,timestamp_t *result,optional_ptr<int,_true> nanos,bool strict)

{
  TimestampCastResult TVar1;
  bool has_offset;
  bool local_19;
  anon_union_16_2_67f50693_for_value local_18;
  
  local_18._0_8_ = 0;
  local_18.pointer.ptr = (char *)0x0;
  local_19 = false;
  TVar1 = TryConvertTimestampTZ(str,len,result,&local_19,(string_t *)&local_18.pointer,nanos);
  if (TVar1 == SUCCESS) {
    if (local_18.pointer.length == 3) {
      if ((byte)(local_18.pointer.prefix[0] | 0x20U) != 0x75) {
        return ERROR_NON_UTC_TIMEZONE;
      }
      if ((byte)(local_18.pointer.prefix[1] | 0x20U) != 0x74) {
        return ERROR_NON_UTC_TIMEZONE;
      }
      if ((byte)(local_18.pointer.prefix[2] | 0x20U) != 99) {
        return ERROR_NON_UTC_TIMEZONE;
      }
    }
    else if (local_18.pointer.length != 0) {
      return ERROR_NON_UTC_TIMEZONE;
    }
    if ((!strict) || (TVar1 = STRICT_UTC, local_19 == false)) {
      TVar1 = SUCCESS;
    }
  }
  return TVar1;
}

Assistant:

TimestampCastResult Timestamp::TryConvertTimestamp(const char *str, idx_t len, timestamp_t &result,
                                                   optional_ptr<int32_t> nanos, bool strict) {
	string_t tz(nullptr, 0);
	bool has_offset = false;
	// We don't understand TZ without an extension, so fail if one was provided.
	auto success = TryConvertTimestampTZ(str, len, result, has_offset, tz, nanos);
	if (success != TimestampCastResult::SUCCESS) {
		return success;
	}
	if (tz.GetSize() == 0) {
		// no timezone provided - success!
		if (strict && has_offset) {
			return TimestampCastResult::STRICT_UTC;
		}
		return TimestampCastResult::SUCCESS;
	}
	if (tz.GetSize() == 3) {
		// we can ONLY handle UTC without ICU being loaded
		auto tz_ptr = tz.GetData();
		if ((tz_ptr[0] == 'u' || tz_ptr[0] == 'U') && (tz_ptr[1] == 't' || tz_ptr[1] == 'T') &&
		    (tz_ptr[2] == 'c' || tz_ptr[2] == 'C')) {
			if (strict && has_offset) {
				return TimestampCastResult::STRICT_UTC;
			}
			return TimestampCastResult::SUCCESS;
		}
	}
	return TimestampCastResult::ERROR_NON_UTC_TIMEZONE;
}